

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O1

void __thiscall CHud::RenderHealthAndAmmo(CHud *this,CNetObj_Character *pCharacter)

{
  IGraphics *pIVar1;
  IClient *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  int iVar7;
  float *pfVar8;
  float *pfVar9;
  ulong uVar10;
  float *pfVar11;
  uint uVar12;
  ulong uVar13;
  float *pfVar14;
  float *pfVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  CQuadItem Array [10];
  float local_d8;
  undefined8 local_d4;
  float local_cc [37];
  long local_38;
  
  pfVar8 = &local_d8;
  pfVar9 = &local_d8;
  pfVar6 = &local_d8;
  pfVar11 = &local_d8;
  pfVar14 = &local_d8;
  pfVar15 = &local_d8;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pCharacter != (CNetObj_Character *)0x0) {
    pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x13])
              (pIVar1,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0xb])()
    ;
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])
              ();
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
              (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    if (pCharacter->m_Weapon == 5) {
      pIVar2 = ((this->super_CComponent).m_pClient)->m_pClient;
      iVar7 = pCharacter->m_AmmoCount - pIVar2->m_CurGameTick;
      iVar4 = (pIVar2->m_GameTickSpeed * (g_pData->m_Weapons).m_Ninja.m_Duration) / 1000;
      iVar3 = iVar4;
      if (iVar7 < iVar4) {
        iVar3 = iVar7;
      }
      iVar5 = 0;
      if (-1 < iVar7) {
        iVar5 = iVar3;
      }
      RenderNinjaBar(this,5.0,29.0,(float)iVar5 / (float)iVar4);
    }
    else {
      uVar13 = 0;
      CRenderTools::SelectSprite
                (&((this->super_CComponent).m_pClient)->m_RenderTools,
                 (g_pData->m_Weapons).m_aId[pCharacter->m_Weapon % 6].m_pSpriteProj,0,0,0);
      uVar12 = pCharacter->m_AmmoCount;
      if (pCharacter->m_Weapon == 3) {
        if (0 < (int)uVar12) {
          uVar16 = 10;
          if ((int)uVar12 < 10) {
            uVar16 = (ulong)uVar12;
          }
          iVar4 = 0;
          uVar13 = 0;
          do {
            *pfVar8 = (float)iVar4 + 6.0;
            pfVar8[1] = 29.0;
            pfVar8[2] = 10.0;
            pfVar8[3] = 10.0;
            uVar13 = uVar13 + 1;
            iVar4 = iVar4 + 0xc;
            pfVar8 = pfVar8 + 4;
          } while (uVar16 != uVar13);
        }
      }
      else if (0 < (int)uVar12) {
        uVar16 = 10;
        if ((int)uVar12 < 10) {
          uVar16 = (ulong)uVar12;
        }
        iVar4 = 0;
        uVar13 = 0;
        do {
          *pfVar9 = (float)iVar4 + 5.0;
          pfVar9[1] = 29.0;
          pfVar9[2] = 12.0;
          pfVar9[3] = 12.0;
          uVar13 = uVar13 + 1;
          iVar4 = iVar4 + 0xc;
          pfVar9 = pfVar9 + 4;
        } while (uVar16 != uVar13);
      }
      pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      (*(pIVar1->super_IInterface)._vptr_IInterface[0x1d])(pIVar1,&local_d8,uVar13 & 0xffffffff);
    }
    uVar16 = 0;
    CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,10,0,0,0);
    uVar12 = pCharacter->m_Health;
    uVar13 = 0;
    if (0 < (int)uVar12) {
      uVar10 = 10;
      if ((int)uVar12 < 10) {
        uVar10 = (ulong)uVar12;
      }
      iVar4 = 0;
      uVar13 = 0;
      do {
        *pfVar6 = (float)iVar4 + 5.0;
        pfVar6[1] = 5.0;
        pfVar6[2] = 12.0;
        pfVar6[3] = 12.0;
        uVar13 = uVar13 + 1;
        iVar4 = iVar4 + 0xc;
        pfVar6 = pfVar6 + 4;
      } while (uVar10 != uVar13);
    }
    pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    uVar12 = (uint)uVar13;
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x1d])(pIVar1,&local_d8,uVar13 & 0xffffffff);
    CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,0xb,0,0,0);
    if (uVar12 < 10) {
      iVar4 = uVar12 * 0xc;
      uVar16 = 0;
      do {
        uVar16 = uVar16 + 1;
        *pfVar11 = (float)iVar4 + 5.0;
        pfVar11[1] = 5.0;
        pfVar11[2] = 12.0;
        pfVar11[3] = 12.0;
        pfVar11 = pfVar11 + 4;
        iVar4 = iVar4 + 0xc;
      } while (10 - uVar12 != uVar16);
    }
    pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x1d])(pIVar1,&local_d8,uVar16 & 0xffffffff);
    uVar16 = 0;
    CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,0xc,0,0,0);
    uVar12 = pCharacter->m_Armor;
    uVar13 = 0;
    if (0 < (int)uVar12) {
      uVar10 = 10;
      if ((int)uVar12 < 10) {
        uVar10 = (ulong)uVar12;
      }
      iVar4 = 0;
      uVar13 = 0;
      do {
        *pfVar14 = (float)iVar4 + 5.0;
        pfVar14[1] = 17.0;
        pfVar14[2] = 12.0;
        pfVar14[3] = 12.0;
        uVar13 = uVar13 + 1;
        iVar4 = iVar4 + 0xc;
        pfVar14 = pfVar14 + 4;
      } while (uVar10 != uVar13);
    }
    pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    uVar12 = (uint)uVar13;
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x1d])(pIVar1,&local_d8,uVar13 & 0xffffffff);
    CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,0xd,0,0,0);
    if (uVar12 < 10) {
      iVar4 = uVar12 * 0xc;
      uVar16 = 0;
      do {
        uVar16 = uVar16 + 1;
        *pfVar15 = (float)iVar4 + 5.0;
        pfVar15[1] = 17.0;
        pfVar15[2] = 12.0;
        pfVar15[3] = 12.0;
        pfVar15 = pfVar15 + 4;
        iVar4 = iVar4 + 0xc;
      } while (10 - uVar12 != uVar16);
    }
    pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x1d])(pIVar1,&local_d8,uVar16 & 0xffffffff);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])
              ();
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[10])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CHud::RenderHealthAndAmmo(const CNetObj_Character *pCharacter)
{
	if(!pCharacter)
		return;

	float x = 5;
	float y = 5;
	int i;
	IGraphics::CQuadItem Array[10];

	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->WrapClamp();

	Graphics()->QuadsBegin();
	Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);

	// render ammo
	if(pCharacter->m_Weapon == WEAPON_NINJA)
	{
		const int Max = g_pData->m_Weapons.m_Ninja.m_Duration * Client()->GameTickSpeed() / 1000;
		float NinjaProgress = clamp(pCharacter->m_AmmoCount-Client()->GameTick(), 0, Max) / (float)Max;
		RenderNinjaBar(x, y+24.f, NinjaProgress);
	}
	else
	{
		RenderTools()->SelectSprite(g_pData->m_Weapons.m_aId[pCharacter->m_Weapon%NUM_WEAPONS].m_pSpriteProj);
		if(pCharacter->m_Weapon == WEAPON_GRENADE)
		{
			for(i = 0; i < minimum(pCharacter->m_AmmoCount, 10); i++)
				Array[i] = IGraphics::CQuadItem(x+1+i*12, y+24, 10, 10);
		}
		else
		{
			for(i = 0; i < minimum(pCharacter->m_AmmoCount, 10); i++)
				Array[i] = IGraphics::CQuadItem(x+i*12, y+24, 12, 12);
		}
		Graphics()->QuadsDrawTL(Array, i);
	}

	int h = 0;

	// render health
	RenderTools()->SelectSprite(SPRITE_HEALTH_FULL);
	for(; h < minimum(pCharacter->m_Health, 10); h++)
		Array[h] = IGraphics::CQuadItem(x+h*12,y,12,12);
	Graphics()->QuadsDrawTL(Array, h);

	i = 0;
	RenderTools()->SelectSprite(SPRITE_HEALTH_EMPTY);
	for(; h < 10; h++)
		Array[i++] = IGraphics::CQuadItem(x+h*12,y,12,12);
	Graphics()->QuadsDrawTL(Array, i);

	// render armor meter
	h = 0;
	RenderTools()->SelectSprite(SPRITE_ARMOR_FULL);
	for(; h < minimum(pCharacter->m_Armor, 10); h++)
		Array[h] = IGraphics::CQuadItem(x+h*12,y+12,12,12);
	Graphics()->QuadsDrawTL(Array, h);

	i = 0;
	RenderTools()->SelectSprite(SPRITE_ARMOR_EMPTY);
	for(; h < 10; h++)
		Array[i++] = IGraphics::CQuadItem(x+h*12,y+12,12,12);
	Graphics()->QuadsDrawTL(Array, i);
	Graphics()->QuadsEnd();
	Graphics()->WrapNormal();
}